

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O1

void __thiscall
cfd::core::Address::Address(Address *this,NetType_conflict type,Pubkey *pubkey,uint8_t prefix)

{
  _Rb_tree_header *p_Var1;
  NetType_conflict NVar2;
  undefined7 in_register_00000009;
  uint8_t local_69 [9];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string *local_58;
  AddressType local_4c;
  CfdSourceLocation local_48;
  
  NVar2 = kCfdConnectionError;
  if ((int)CONCAT71(in_register_00000009,prefix) == 0) {
    NVar2 = type;
  }
  this->type_ = NVar2;
  this->addr_type_ = kP2pkhAddress;
  this->witness_ver_ = kVersionNone;
  local_58 = &this->address_;
  local_60 = &(this->address_).field_2;
  (this->address_)._M_dataplus._M_p = (pointer)local_60;
  local_69[0] = prefix;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  ByteData::ByteData(&this->hash_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->pubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)pubkey);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_);
  p_Var1 = &(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl = 0;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  CalculateP2PKH(this,local_69[0]);
  local_48.filename = "cfdcore_address.cpp";
  local_48.line = 0x12e;
  local_48.funcname = "Address";
  local_4c = kP2pkhAddress;
  logger::log<cfd::core::NetType&,cfd::core::AddressType&,unsigned_char&>
            (&local_48,kCfdLogLevelInfo,"call Address({},{},{})",&this->type_,&local_4c,local_69);
  return;
}

Assistant:

Address::Address(NetType type, const Pubkey& pubkey, uint8_t prefix)
    : type_((prefix != 0) ? kCustomChain : type),
      addr_type_(AddressType::kP2pkhAddress),
      witness_ver_(kVersionNone),
      address_(""),
      hash_(),
      pubkey_(pubkey),
      schnorr_pubkey_(),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));
  CalculateP2PKH(prefix);
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_,
      AddressType::kP2pkhAddress, prefix);
}